

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O0

bool Imath_3_2::(anonymous_namespace)::jacobiRotation<0,2,1,float>
               (Matrix33<float> *A,Matrix33<float> *V,Vec3<float> *Z,float tol)

{
  float fVar1;
  bool bVar2;
  float *pfVar3;
  float *pfVar4;
  Vec3<float> *in_RDX;
  int __x;
  Matrix33<float> *in_RDI;
  Matrix33<float> *pMVar5;
  float in_XMM0_Da;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar6;
  float extraout_XMM0_Da_01;
  float fVar7;
  float fVar8;
  float fVar9;
  double dVar10;
  float nu2;
  float nu1;
  float *offd2;
  float *offd1;
  float h;
  float tau;
  float s;
  float c;
  float t;
  float rho;
  float mu2;
  float mu1;
  float z;
  float y;
  float x;
  
  pfVar3 = Matrix33<float>::operator[](in_RDI,0);
  fVar6 = *pfVar3;
  pfVar3 = Matrix33<float>::operator[](in_RDI,0);
  fVar1 = pfVar3[2];
  pMVar5 = in_RDI;
  pfVar3 = Matrix33<float>::operator[](in_RDI,2);
  fVar8 = pfVar3[2];
  __x = (int)pMVar5;
  std::abs(__x);
  std::abs(__x);
  bVar2 = in_XMM0_Da * extraout_XMM0_Da_00 < extraout_XMM0_Da;
  if (bVar2) {
    fVar6 = (fVar8 - fVar6) / (fVar1 * 2.0);
    std::abs(__x);
    dVar10 = std::sqrt((double)(ulong)(uint)(fVar6 * fVar6 + 1.0));
    fVar7 = (float)(~-(uint)(fVar6 < 0.0) & 0x3f800000 | -(uint)(fVar6 < 0.0) & 0xbf800000) /
            (extraout_XMM0_Da_01 + SUB84(dVar10,0));
    dVar10 = std::sqrt((double)(ulong)(uint)(fVar7 * fVar7 + 1.0));
    fVar6 = 1.0 / SUB84(dVar10,0);
    fVar8 = fVar7 * fVar6;
    fVar9 = fVar8 / (fVar6 + 1.0);
    fVar7 = fVar7 * fVar1;
    pfVar3 = Vec3<float>::operator[](in_RDX,0);
    *pfVar3 = *pfVar3 - fVar7;
    pfVar3 = Vec3<float>::operator[](in_RDX,2);
    *pfVar3 = fVar7 + *pfVar3;
    pfVar3 = Matrix33<float>::operator[](in_RDI,0);
    *pfVar3 = *pfVar3 - fVar7;
    pfVar3 = Matrix33<float>::operator[](in_RDI,2);
    pfVar3[2] = fVar7 + pfVar3[2];
    pfVar3 = Matrix33<float>::operator[](in_RDI,0);
    pfVar3[2] = 0.0;
    pfVar3 = Matrix33<float>::operator[](in_RDI,0);
    pfVar4 = Matrix33<float>::operator[](in_RDI,1);
    pMVar5 = (Matrix33<float> *)(pfVar4 + 2);
    fVar6 = pfVar3[1];
    fVar1 = pMVar5->x[0][0];
    pfVar3[1] = -fVar8 * (fVar9 * fVar6 + fVar1) + fVar6;
    pMVar5->x[0][0] = fVar8 * (-fVar9 * fVar1 + fVar6) + fVar1;
    jacobiRotateRight<0,2,Imath_3_2::Matrix33<float>>(pMVar5,fVar6,fVar1);
  }
  else {
    pfVar3 = Matrix33<float>::operator[](in_RDI,0);
    pfVar3[2] = 0.0;
  }
  return bVar2;
}

Assistant:

bool
jacobiRotation (Matrix33<T>& A, Matrix33<T>& V, Vec3<T>& Z, const T tol)
{
    // Load everything into local variables to make things easier on the
    // optimizer:
    const T x = A[j][j];
    const T y = A[j][k];
    const T z = A[k][k];

    // The first stage diagonalizes,
    //   [ c  s ]^T [ x y ] [ c -s ]  = [ d1   0 ]
    //   [ -s c ]   [ y z ] [ s  c ]    [  0  d2 ]
    const T mu1 = z - x;
    const T mu2 = 2 * y;

    if (std::abs (mu2) <= tol * std::abs (mu1))
    {
        // We've decided that the off-diagonal entries are already small
        // enough, so we'll set them to zero.  This actually appears to result
        // in smaller errors than leaving them be, possibly because it prevents
        // us from trying to do extra rotations later that we don't need.
        A[j][k] = 0;
        return false;
    }
    const T rho = mu1 / mu2;
    const T t   = (rho < 0 ? T (-1) : T (1)) /
                (std::abs (rho) + std::sqrt (1 + rho * rho));
    const T c   = T (1) / std::sqrt (T (1) + t * t);
    const T s   = t * c;
    const T tau = s / (T (1) + c);
    const T h   = t * y;

    // Update diagonal elements.
    Z[j] -= h;
    Z[k] += h;
    A[j][j] -= h;
    A[k][k] += h;

    // For the entries we just zeroed out, we'll just set them to 0, since
    // they should be 0 up to machine precision.
    A[j][k] = 0;

    // We only update upper triagnular elements of A, since
    // A is supposed to be symmetric.
    T&      offd1 = l < j ? A[l][j] : A[j][l];
    T&      offd2 = l < k ? A[l][k] : A[k][l];
    const T nu1   = offd1;
    const T nu2   = offd2;
    offd1         = nu1 - s * (nu2 + tau * nu1);
    offd2         = nu2 + s * (nu1 - tau * nu2);

    // Apply rotation to V
    jacobiRotateRight<j, k> (V, s, tau);

    return true;
}